

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

void __thiscall
PGSStreamReader::setVideoInfo(PGSStreamReader *this,uint16_t width,uint16_t height,double fps)

{
  double fps_local;
  uint16_t height_local;
  uint16_t width_local;
  PGSStreamReader *this_local;
  
  this->m_scaled_width = width;
  this->m_scaled_height = height;
  this->m_newFps = fps;
  if ((width != 0) && (height != 0)) {
    text_subtitles::TextToPGSConverter::enlargeCrop
              (this->m_render,width,height,&this->m_scaled_width,&this->m_scaled_height);
  }
  text_subtitles::TextToPGSConverter::setVideoInfo
            (this->m_render,this->m_scaled_width,this->m_scaled_height,this->m_newFps);
  return;
}

Assistant:

void PGSStreamReader::setVideoInfo(const uint16_t width, const uint16_t height, const double fps)
{
    m_scaled_width = width;
    m_scaled_height = height;
    m_newFps = fps;
    if (width && height)
        m_render->enlargeCrop(width, height, &m_scaled_width, &m_scaled_height);
    m_render->setVideoInfo(m_scaled_width, m_scaled_height, m_newFps);
}